

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O0

LY_ERR ly_out_reset(ly_out *out)

{
  int iVar1;
  __off_t _Var2;
  int *piVar3;
  char *pcVar4;
  ly_out *out_local;
  
  if (out == (ly_out *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","out","ly_out_reset");
    out_local._4_4_ = LY_EINVAL;
  }
  else {
    switch(out->type) {
    case LY_OUT_FD:
      _Var2 = lseek((out->method).fd,0,0);
      if ((_Var2 == -1) && (piVar3 = __errno_location(), *piVar3 != 0x1d)) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"Seeking output file descriptor failed (%s).",pcVar4);
        return LY_ESYS;
      }
      piVar3 = __errno_location();
      if ((*piVar3 != 0x1d) && (iVar1 = ftruncate((out->method).fd,0), iVar1 == -1)) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"Truncating output file failed (%s).",pcVar4);
        return LY_ESYS;
      }
      break;
    case LY_OUT_FDSTREAM:
    case LY_OUT_FILE:
    case LY_OUT_FILEPATH:
      iVar1 = fseek((FILE *)(out->method).f,0,0);
      if ((iVar1 == -1) && (piVar3 = __errno_location(), *piVar3 != 0x1d)) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"Seeking output file stream failed (%s).",pcVar4);
        return LY_ESYS;
      }
      piVar3 = __errno_location();
      if (*piVar3 != 0x1d) {
        iVar1 = fileno((FILE *)(out->method).f);
        iVar1 = ftruncate(iVar1,0);
        if (iVar1 == -1) {
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"Truncating output file failed (%s).",pcVar4);
          return LY_ESYS;
        }
      }
      break;
    case LY_OUT_MEMORY:
      if (((out->method).f != (FILE *)0x0) && (*(out->method).mem.buf != (char *)0x0)) {
        memset(*(out->method).mem.buf,0,(out->method).mem.len);
      }
      out->printed = 0;
      (out->method).fpath.filepath = (char *)0x0;
      break;
    case LY_OUT_CALLBACK:
      break;
    case LY_OUT_ERROR:
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/out.c",0x131);
      return LY_EINT;
    }
    out_local._4_4_ = LY_SUCCESS;
  }
  return out_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_out_reset(struct ly_out *out)
{
    LY_CHECK_ARG_RET(NULL, out, LY_EINVAL);

    switch (out->type) {
    case LY_OUT_ERROR:
        LOGINT(NULL);
        return LY_EINT;
    case LY_OUT_FD:
        if ((lseek(out->method.fd, 0, SEEK_SET) == -1) && (errno != ESPIPE)) {
            LOGERR(NULL, LY_ESYS, "Seeking output file descriptor failed (%s).", strerror(errno));
            return LY_ESYS;
        }
        if ((errno != ESPIPE) && (ftruncate(out->method.fd, 0) == -1)) {
            LOGERR(NULL, LY_ESYS, "Truncating output file failed (%s).", strerror(errno));
            return LY_ESYS;
        }
        break;
    case LY_OUT_FDSTREAM:
    case LY_OUT_FILE:
    case LY_OUT_FILEPATH:
        if ((fseek(out->method.f, 0, SEEK_SET) == -1) && (errno != ESPIPE)) {
            LOGERR(NULL, LY_ESYS, "Seeking output file stream failed (%s).", strerror(errno));
            return LY_ESYS;
        }
        if ((errno != ESPIPE) && (ftruncate(fileno(out->method.f), 0) == -1)) {
            LOGERR(NULL, LY_ESYS, "Truncating output file failed (%s).", strerror(errno));
            return LY_ESYS;
        }
        break;
    case LY_OUT_MEMORY:
        if (out->method.mem.buf && *out->method.mem.buf) {
            memset(*out->method.mem.buf, 0, out->method.mem.len);
        }
        out->printed = 0;
        out->method.mem.len = 0;
        break;
    case LY_OUT_CALLBACK:
        /* nothing to do (not seekable) */
        break;
    }

    return LY_SUCCESS;
}